

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionData *
anon_unknown.dwarf_94284::ImplementPrototype(ExpressionContext *ctx,FunctionData *function)

{
  FunctionData *function_00;
  uint hash;
  FunctionData *prototype;
  ScopeData *pSVar1;
  NodeIterator it;
  
  pSVar1 = ctx->scope;
  if ((pSVar1->type | SCOPE_FUNCTION) == SCOPE_TYPE) {
    pSVar1 = ctx->globalScope;
  }
  hash = InplaceStr::hash(&function->name->name);
  it = DirectChainedMap<IdentifierLookupResult>::first(&pSVar1->idLookupMap,hash);
  if (it.node != (Node *)0x0) {
    for (; it.node != (Node *)0x0;
        it = DirectChainedMap<IdentifierLookupResult>::next(&ctx->scope->idLookupMap,it)) {
      function_00 = *(FunctionData **)(it.node + 0x10);
      if (((function_00 != function && function_00 != (FunctionData *)0x0) &&
          (function_00->isPrototype == true)) && (function_00->type == function->type)) {
        function_00->implementation = function;
        ExpressionContext::HideFunction(ctx,function_00);
        return function_00;
      }
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

FunctionData* ImplementPrototype(ExpressionContext &ctx, FunctionData *function)
	{
		ScopeData *lookupScope = ctx.scope->type == SCOPE_TYPE || ctx.scope->type == SCOPE_NAMESPACE ? ctx.globalScope : ctx.scope;

		if(DirectChainedMap<IdentifierLookupResult>::NodeIterator curr = lookupScope->idLookupMap.first(function->name->name.hash()))
		{
			while(curr)
			{
				FunctionData *option = curr.node->value.function;

				if(option && option != function && option->isPrototype && option->type == function->type)
					break;

				curr = ctx.scope->idLookupMap.next(curr);
			}

			if(curr)
			{
				FunctionData *prototype = curr.node->value.function;

				prototype->implementation = function;

				ctx.HideFunction(prototype);

				return prototype;
			}
		}

		return NULL;
	}